

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O2

void __thiscall deqp::ShaderRenderCase::~ShaderRenderCase(ShaderRenderCase *this)

{
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_01dfe628;
  deinit(this);
  std::_Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::~_Vector_base
            (&(this->m_textures).
              super__Vector_base<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>);
  std::_Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
  ~_Vector_base(&(this->m_userAttribTransforms).
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               );
  std::__cxx11::string::~string((string *)&this->m_fragShaderSource);
  std::__cxx11::string::~string((string *)&this->m_vertShaderSource);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ShaderRenderCase::~ShaderRenderCase(void)
{
	ShaderRenderCase::deinit();
}